

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O3

void __thiscall
duckdb::BindContext::TransferUsingBinding
          (BindContext *this,BindContext *current_context,
          optional_ptr<duckdb::UsingColumnSet,_true> current_set,UsingColumnSet *new_set,
          string *using_column)

{
  __hashtable *__h;
  __node_gen_type __node_gen;
  optional_ptr<duckdb::UsingColumnSet,_true> local_38;
  UsingColumnSet *local_30;
  _Hashtable<std::reference_wrapper<duckdb::UsingColumnSet>,std::reference_wrapper<duckdb::UsingColumnSet>,std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>>,std::__detail::_Identity,duckdb::ReferenceEquality<duckdb::UsingColumnSet>,duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_28;
  
  local_38.ptr = current_set.ptr;
  local_28 = (_Hashtable<std::reference_wrapper<duckdb::UsingColumnSet>,std::reference_wrapper<duckdb::UsingColumnSet>,std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>>,std::__detail::_Identity,duckdb::ReferenceEquality<duckdb::UsingColumnSet>,duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->using_columns,using_column);
  local_30 = new_set;
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::UsingColumnSet>,std::reference_wrapper<duckdb::UsingColumnSet>,std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>>,std::__detail::_Identity,duckdb::ReferenceEquality<duckdb::UsingColumnSet>,duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<std::reference_wrapper<duckdb::UsingColumnSet>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::reference_wrapper<duckdb::UsingColumnSet>,true>>>>
            (local_28);
  if (current_set.ptr != (UsingColumnSet *)0x0) {
    optional_ptr<duckdb::UsingColumnSet,_true>::CheckValid(&local_38);
    RemoveUsingBinding(current_context,using_column,local_38.ptr);
  }
  return;
}

Assistant:

void BindContext::TransferUsingBinding(BindContext &current_context, optional_ptr<UsingColumnSet> current_set,
                                       UsingColumnSet &new_set, const string &using_column) {
	AddUsingBinding(using_column, new_set);
	if (current_set) {
		current_context.RemoveUsingBinding(using_column, *current_set);
	}
}